

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O0

void namingConventions::adjustForAllFiles
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *inputFiles,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *oldNames,vector<Pda_*,_std::allocator<Pda_*>_> *pdas,bool forClass)

{
  Pda *this;
  bool bVar1;
  _Ios_Openmode _Var2;
  reference pbVar3;
  char *pcVar4;
  istream *piVar5;
  size_type sVar6;
  reference ppPVar7;
  reference pvVar8;
  reference pvVar9;
  ulong uVar10;
  ulong uVar11;
  string local_7a0 [8];
  ofstream editedFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  Pda *local_480;
  Pda *tester;
  undefined1 local_470 [4];
  uint i;
  string longestFit;
  string word;
  stringstream stream;
  string local_298 [8];
  string editedstring;
  string line;
  fstream buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool forClass_local;
  vector<Pda_*,_std::allocator<Pda_*>_> *pdas_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *oldNames_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *inputFiles_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(inputFiles);
  file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(inputFiles);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&file), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var2 = std::operator|(_S_in,_S_out);
    std::fstream::fstream((void *)((long)&line.field_2 + 8),pcVar4,_Var2);
    std::__cxx11::string::string((string *)(editedstring.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_298);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),
                          (string *)(editedstring.field_2._M_local_buf + 8));
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar1) break;
      _Var2 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)(word.field_2._M_local_buf + 8),
                 (string *)(editedstring.field_2._M_local_buf + 8),_Var2);
      std::__cxx11::string::string((string *)(longestFit.field_2._M_local_buf + 8));
      while( true ) {
        piVar5 = std::operator>>((istream *)(word.field_2._M_local_buf + 8),
                                 (string *)(longestFit.field_2._M_local_buf + 8));
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar1) break;
        std::__cxx11::string::string((string *)local_470);
        for (tester._4_4_ = 0; uVar10 = (ulong)tester._4_4_,
            sVar6 = std::vector<Pda_*,_std::allocator<Pda_*>_>::size(pdas), uVar10 < sVar6;
            tester._4_4_ = tester._4_4_ + 1) {
          ppPVar7 = std::vector<Pda_*,_std::allocator<Pda_*>_>::operator[](pdas,(ulong)tester._4_4_)
          ;
          this = *ppPVar7;
          local_480 = this;
          std::__cxx11::string::string
                    ((string *)&local_4a0,(string *)(longestFit.field_2._M_local_buf + 8));
          bVar1 = Pda::traverse(this,&local_4a0);
          std::__cxx11::string::~string((string *)&local_4a0);
          if (bVar1) {
            if (forClass) {
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](oldNames,(ulong)tester._4_4_);
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](oldNames,(ulong)tester._4_4_);
              std::__cxx11::string::string((string *)&local_500,(string *)pvVar9);
              correctClassName(&local_4e0,&local_500);
              editToNewName(&local_4c0,(string *)((long)&longestFit.field_2 + 8),pvVar8,&local_4e0);
              std::__cxx11::string::operator=
                        ((string *)(longestFit.field_2._M_local_buf + 8),(string *)&local_4c0);
              std::__cxx11::string::~string((string *)&local_4c0);
              std::__cxx11::string::~string((string *)&local_4e0);
              std::__cxx11::string::~string((string *)&local_500);
            }
            else {
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](oldNames,(ulong)tester._4_4_);
              pvVar9 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](oldNames,(ulong)tester._4_4_);
              std::__cxx11::string::string((string *)&local_560,(string *)pvVar9);
              correctName(&local_540,&local_560);
              editToNewName(&local_520,(string *)((long)&longestFit.field_2 + 8),pvVar8,&local_540);
              std::__cxx11::string::operator=
                        ((string *)(longestFit.field_2._M_local_buf + 8),(string *)&local_520);
              std::__cxx11::string::~string((string *)&local_520);
              std::__cxx11::string::~string((string *)&local_540);
              std::__cxx11::string::~string((string *)&local_560);
            }
            uVar10 = std::__cxx11::string::size();
            uVar11 = std::__cxx11::string::size();
            if (uVar11 < uVar10) {
              std::__cxx11::string::operator=
                        ((string *)local_470,(string *)(longestFit.field_2._M_local_buf + 8));
            }
          }
        }
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          std::operator+(&local_580,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_470,' ');
          std::__cxx11::string::operator+=(local_298,(string *)&local_580);
          std::__cxx11::string::~string((string *)&local_580);
        }
        else {
          std::operator+(&local_5a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&longestFit.field_2 + 8),' ');
          std::__cxx11::string::operator+=(local_298,(string *)&local_5a0);
          std::__cxx11::string::~string((string *)&local_5a0);
        }
        std::__cxx11::string::~string((string *)local_470);
      }
      std::__cxx11::string::operator+=(local_298,"\n");
      std::__cxx11::string::~string((string *)(longestFit.field_2._M_local_buf + 8));
      std::__cxx11::stringstream::~stringstream((stringstream *)(word.field_2._M_local_buf + 8));
    }
    std::fstream::close();
    std::ofstream::ofstream(local_7a0);
    std::operator|(_S_out,_S_trunc);
    std::ofstream::open(local_7a0,(_Ios_Openmode)pbVar3);
    std::operator<<((ostream *)local_7a0,local_298);
    std::ofstream::close();
    std::ofstream::~ofstream(local_7a0);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string((string *)(editedstring.field_2._M_local_buf + 8));
    std::fstream::~fstream((void *)((long)&line.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void
namingConventions::adjustForAllFiles(const std::vector<std::string> &inputFiles, std::vector<std::string> &oldNames,
                                     std::vector<Pda *> &pdas, bool forClass) {
    for (auto &file:inputFiles) {
        std::fstream buffer(file.c_str());
        std::string line;
        std::string editedstring;

        // loop over alle lines
        while (std::getline(buffer, line)) {
            std::stringstream stream(line);
            std::string word;
            // loop over elk woord op een line
            while (stream >> word) {
                // zoekt de juiste classname aan de hand van pda's, past word correct aan
                std::string longestFit;
                for (unsigned int i = 0; i < pdas.size(); ++i) {
                    Pda *tester = pdas[i];
                    if (tester->traverse(word)) {
                        if (forClass) {
                            word = editToNewName(word, oldNames[i], namingConventions::correctClassName(oldNames[i]));

                        } else {
                            word = editToNewName(word, oldNames[i], correctName(oldNames[i]));
                        }
                        if (word.size() > longestFit.size()) {
                            longestFit = word;
                        }

                    }
                }
                if (!longestFit.empty()) {
                    editedstring += longestFit + ' ';
                } else {
                    editedstring += word + ' ';
                }
            }
            editedstring += "\n";

        }
            // schrijft string naar file
            buffer.close();
            std::ofstream editedFile;
            editedFile.open(file, std::ofstream::out | std::ofstream::trunc);
            editedFile << editedstring;
            editedFile.close();

    }
}